

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service_base::
async_receive<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::read_op<asio::mutable_buffers_1>,asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::resp_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,unsigned_int,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::resp_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,unsigned_int,std::error_code,unsigned_long)>>>,asio::any_io_executor>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          mutable_buffers_1 *buffers,message_flags flags,
          io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>
          *handler,any_io_executor *io_ex)

{
  state_type sVar1;
  int iVar2;
  int iVar3;
  socket_type sVar4;
  error_category *peVar5;
  size_t sVar6;
  undefined4 uVar7;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
  *prVar8;
  reactor_op_cancellation *prVar9;
  template_rebind_alloc<reactive_socket_recv_op<mutable_buffers_1,_io_op<basic_stream_socket<tcp>,_read_op<mutable_buffers_1>,_read_op<stream<basic_stream_socket<tcp>_&>,_mutable_buffers_1,_const_mutable_buffer_*,_transfer_all_t,__Bind<void_(asio_rpc_client::*(shared_ptr<asio_rpc_client>,_shared_ptr<req_msg>,_shared_ptr<resp_msg>,_function<void_(shared_ptr<resp_msg>_&,_shared_ptr<rpc_exception>_&)>,_shared_ptr<buffer>,_unsigned_int,__Placeholder<1>,__Placeholder<2>))(shared_ptr<req_msg>_&,_shared_ptr<resp_msg>_&,_function<void_(shared_ptr<resp_msg>_&,_shared_ptr<rpc_exception>_&)>_&,_shared_ptr<buffer>_&,_unsigned_int,_error_code,_unsigned_long)>_>_>,_any_io_executor>_>
  a;
  undefined8 uVar10;
  long *in_FS_OFFSET;
  type slot;
  ptr local_70;
  cancellation_slot local_58;
  any_io_executor *local_50;
  op_types local_44;
  per_descriptor_data *local_40;
  reactor *local_38;
  
  iVar2 = handler->start_;
  iVar3 = (handler->handler_).start_;
  local_58.handler_ = (cancellation_handler_base **)0x0;
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -8) + 8);
  }
  local_70.h = handler;
  local_50 = io_ex;
  prVar8 = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
            *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar10,0x178,0x10);
  local_70.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
                *)0x0;
  sVar4 = impl->socket_;
  sVar1 = impl->state_;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.next_ = (scheduler_operation *)0x0;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.func_ =
       reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
       ::do_complete;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  super_operation.task_result_ = 0;
  uVar7 = *(undefined4 *)&(this->success_ec_).field_0x4;
  peVar5 = (this->success_ec_)._M_cat;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_.
  _M_value = (this->success_ec_)._M_value;
  *(undefined4 *)
   &(prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_.
    field_0x4 = uVar7;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_cat
       = peVar5;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  cancellation_key_ = (void *)0x0;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  perform_func_ = reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).socket_ = sVar4;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).state_ = sVar1;
  sVar6 = (buffers->super_mutable_buffer).size_;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.
  super_mutable_buffer.data_ = (buffers->super_mutable_buffer).data_;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.
  super_mutable_buffer.size_ = sVar6;
  (prVar8->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).flags_ = flags;
  local_70.v = prVar8;
  asio::ssl::detail::
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>
  ::io_op(&prVar8->handler_,handler);
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
  handler_work_base(&(prVar8->work_).
                     super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                    ,0,0,local_50);
  local_70.p = prVar8;
  if (local_58.handler_ != (cancellation_handler_base **)0x0) {
    local_38 = this->reactor_;
    local_40 = &impl->reactor_data_;
    local_44 = read_op;
    prVar9 = cancellation_slot::
             emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                       (&local_58,&local_38,&local_40,&impl->socket_,&local_44);
    ((local_70.p)->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
    cancellation_key_ = prVar9;
  }
  start_op(this,impl,(flags & 1U) * 2,(reactor_op *)local_70.p,iVar2 == 0 || iVar3 == 0,
           (flags & 1U) == 0,(bool)((buffers->super_mutable_buffer).size_ == 0 & impl->state_ >> 4))
  ;
  local_70.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
                *)0x0;
  local_70.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
                *)0x0;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::read_op<asio::mutable_buffers_1>,_asio::detail::read_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::resp_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_unsigned_int,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_unsigned_int,_std::error_code,_unsigned_long)>_>_>,_asio::any_io_executor>
  ::ptr::reset(&local_70);
  return;
}

Assistant:

void async_receive(base_implementation_type& impl,
      const MutableBufferSequence& buffers, socket_base::message_flags flags,
      Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    typename associated_cancellation_slot<Handler>::type slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_recv_op<
        MutableBufferSequence, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_,
        impl.state_, buffers, flags, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::read_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_receive"));

    start_op(impl,
        (flags & socket_base::message_out_of_band)
          ? reactor::except_op : reactor::read_op,
        p.p, is_continuation,
        (flags & socket_base::message_out_of_band) == 0,
        ((impl.state_ & socket_ops::stream_oriented)
          && buffer_sequence_adapter<asio::mutable_buffer,
            MutableBufferSequence>::all_empty(buffers)));
    p.v = p.p = 0;
  }